

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::EmbeddingLayerParams::CopyFrom
          (EmbeddingLayerParams *this,EmbeddingLayerParams *from)

{
  if (from != this) {
    if (this->weights_ != (WeightParams *)0x0) {
      (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->weights_ = (WeightParams *)0x0;
    if (this->bias_ != (WeightParams *)0x0) {
      (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
    }
    *(undefined8 *)((long)&this->inputdim_ + 1) = 0;
    *(undefined8 *)((long)&this->outputchannels_ + 1) = 0;
    this->bias_ = (WeightParams *)0x0;
    this->inputdim_ = 0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void EmbeddingLayerParams::CopyFrom(const EmbeddingLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.EmbeddingLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}